

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

char * fy_node_get_short_path(fy_node *fyn)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  fy_anchor *fyn_parent;
  fy_node *fyn_00;
  int iVar5;
  size_t sVar6;
  char *__s;
  char *pcVar7;
  ulong uVar8;
  undefined8 uStack_160;
  char acStack_158 [7];
  bool local_151;
  char *local_150;
  char *local_148;
  size_t local_140;
  char *local_138;
  uint local_12c;
  size_t local_128;
  char *local_120;
  uint local_114;
  char *local_110;
  bool local_101;
  char *local_100;
  char *local_f8;
  char *local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t __len_1;
  char *__stra_1;
  char *__str_1;
  char *__strb_1;
  size_t local_b8;
  size_t local_b0;
  size_t __len;
  char *__stra;
  char *__str;
  char *__strb;
  char *_s_1;
  char *_buf_1;
  int _sizew_1;
  int _size_1;
  char *__fmt_1;
  char *local_68;
  char *_s;
  char *_buf;
  int _sizew;
  int _size;
  char *__fmt;
  char *path;
  char *str;
  size_t len;
  char *text;
  fy_anchor *fya;
  fy_node *fyn_anchor;
  fy_node *fyn_local;
  
  __s = acStack_158;
  if (fyn == (fy_node *)0x0) {
    fyn_local = (fy_node *)0x0;
  }
  else {
    uStack_160 = 0x12e99c;
    fyn_anchor = fyn;
    text = (char *)fy_node_get_nearest_anchor(fyn);
    if ((fy_anchor *)text == (fy_anchor *)0x0) {
      uStack_160 = 0x12e9b0;
      fyn_local = (fy_node *)fy_node_get_path(fyn_anchor);
    }
    else {
      uStack_160 = 0x12e9c2;
      fya = (fy_anchor *)fy_anchor_node((fy_anchor *)text);
      uStack_160 = 0x12e9d3;
      len = (size_t)fy_anchor_get_text((fy_anchor *)text,(size_t *)&str);
      if ((char *)len == (char *)0x0) {
        fyn_local = (fy_node *)0x0;
      }
      else {
        if ((fy_node *)fya == fyn_anchor) {
          __sizew = "*%.*s";
          _s = (char *)0x0;
          uStack_160 = 0x12ea28;
          _buf._4_4_ = snprintf((char *)0x0,0,"*%.*s",(ulong)str & 0xffffffff,len);
          sVar3 = len;
          pcVar7 = __sizew;
          if (_buf._4_4_ != -1) {
            lVar1 = -((long)_buf._4_4_ + 0x10U & 0xfffffffffffffff0);
            __s = acStack_158 + lVar1;
            iVar5 = _buf._4_4_ + 1;
            _s = __s;
            *(undefined8 *)((long)&uStack_160 + lVar1) = 0x12ea70;
            _buf._0_4_ = snprintf(__s,(long)iVar5,pcVar7,(ulong)str & 0xffffffff,sVar3);
            pcVar7 = _s;
            if (_buf._4_4_ != (int)_buf) {
              *(undefined8 *)((long)&uStack_160 + lVar1) = 0x12ea9c;
              __assert_fail("_size == _sizew",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                            ,0x116b,"char *fy_node_get_short_path(struct fy_node *)");
            }
            local_100 = _s;
            *(undefined8 *)((long)&uStack_160 + lVar1) = 0x12eab0;
            sVar6 = strlen(pcVar7);
            local_68 = local_100 + sVar6;
            while( true ) {
              local_101 = false;
              if (_s < local_68) {
                local_101 = local_68[-1] == '\n';
              }
              if (local_101 == false) break;
              pcVar7 = local_68 + -1;
              local_68 = local_68 + -1;
              *pcVar7 = '\0';
            }
          }
          __fmt_1 = _s;
          path = _s;
        }
        else {
          __sizew_1 = "*%.*s/%s";
          _s_1 = (char *)0x0;
          local_120 = "*%.*s/%s";
          uStack_160 = 0x12eb5f;
          local_114 = (uint)str;
          local_110 = (char *)len;
          __stra = fy_node_get_path_relative_to((fy_node *)fya,fyn_anchor);
          __len = 0;
          local_b0 = 0xffffffffffffffff;
          __s = acStack_158;
          if (__stra != (char *)0x0) {
            uStack_160 = 0x12eb9c;
            sVar6 = strlen(__stra);
            pcVar7 = __stra;
            lVar1 = -(sVar6 + 0x10 & 0xfffffffffffffff0);
            __s = acStack_158 + lVar1;
            local_b0 = sVar6;
            __len = (size_t)__s;
            *(undefined8 *)((long)&uStack_160 + lVar1) = 0x12ebdc;
            memcpy(__s,pcVar7,sVar6);
            pcVar7 = __stra;
            *(undefined1 *)(__len + local_b0) = 0;
            *(undefined8 *)((long)&uStack_160 + lVar1) = 0x12ebfa;
            free(pcVar7);
          }
          pcVar2 = local_110;
          pcVar7 = local_120;
          local_b8 = __len;
          __str = (char *)__len;
          if (__len == 0) {
            __str = "";
          }
          pcVar4 = __str;
          uVar8 = (ulong)local_114;
          __strb_1 = __str;
          __s[-8] = 'e';
          __s[-7] = -0x14;
          __s[-6] = '\x12';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          _buf_1._4_4_ = snprintf((char *)0x0,0,pcVar7,uVar8,pcVar2,pcVar4);
          fyn_00 = fyn_anchor;
          fyn_parent = fya;
          if (_buf_1._4_4_ != -1) {
            __s = __s + -((long)_buf_1._4_4_ + 0x10U & 0xfffffffffffffff0);
            local_140 = (size_t)(_buf_1._4_4_ + 1);
            local_138 = __sizew_1;
            local_12c = (uint)str;
            local_128 = len;
            local_148 = __s;
            _s_1 = __s;
            __s[-8] = -0x2e;
            __s[-7] = -0x14;
            __s[-6] = '\x12';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            pcVar7 = fy_node_get_path_relative_to((fy_node *)fyn_parent,fyn_00);
            __len_1 = 0;
            local_e0 = 0xffffffffffffffff;
            __stra_1 = pcVar7;
            if (pcVar7 != (char *)0x0) {
              __s[-8] = '\x0f';
              __s[-7] = -0x13;
              __s[-6] = '\x12';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              sVar6 = strlen(pcVar7);
              pcVar7 = __stra_1;
              __s = __s + -(sVar6 + 0x10 & 0xfffffffffffffff0);
              local_e0 = sVar6;
              __len_1 = (size_t)__s;
              __s[-8] = 'O';
              __s[-7] = -0x13;
              __s[-6] = '\x12';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              memcpy(__s,pcVar7,sVar6);
              pcVar7 = __stra_1;
              *(undefined1 *)(__len_1 + local_e0) = 0;
              __s[-8] = 'm';
              __s[-7] = -0x13;
              __s[-6] = '\x12';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              free(pcVar7);
            }
            sVar3 = local_128;
            pcVar2 = local_138;
            sVar6 = local_140;
            pcVar7 = local_148;
            local_e8 = __len_1;
            __str_1 = (char *)__len_1;
            if (__len_1 == 0) {
              __str_1 = "";
            }
            pcVar4 = __str_1;
            uVar8 = (ulong)local_12c;
            local_f0 = __str_1;
            __s[-8] = -0x21;
            __s[-7] = -0x13;
            __s[-6] = '\x12';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            _buf_1._0_4_ = snprintf(pcVar7,sVar6,pcVar2,uVar8,sVar3,pcVar4);
            pcVar7 = _s_1;
            if (_buf_1._4_4_ != (int)_buf_1) {
              __s[-8] = '\v';
              __s[-7] = -0x12;
              __s[-6] = '\x12';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              __assert_fail("_size == _sizew",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                            ,0x116e,"char *fy_node_get_short_path(struct fy_node *)");
            }
            local_150 = _s_1;
            __s[-8] = '\x1f';
            __s[-7] = -0x12;
            __s[-6] = '\x12';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            sVar6 = strlen(pcVar7);
            __strb = local_150 + sVar6;
            while( true ) {
              local_151 = false;
              if (_s_1 < __strb) {
                local_151 = __strb[-1] == '\n';
              }
              if (local_151 == false) break;
              pcVar7 = __strb + -1;
              __strb = __strb + -1;
              *pcVar7 = '\0';
            }
          }
          local_f8 = _s_1;
          path = _s_1;
        }
        pcVar7 = path;
        *(undefined8 *)(__s + -8) = 0x12eea7;
        fyn_local = (fy_node *)strdup(pcVar7);
      }
    }
  }
  return (char *)fyn_local;
}

Assistant:

char *fy_node_get_short_path(struct fy_node *fyn) {
    struct fy_node *fyn_anchor;
    struct fy_anchor *fya;
    const char *text;
    size_t len;
    const char *str;
    char *path;

    if (!fyn)
        return NULL;

    /* get the nearest anchor traversing upwards */
    fya = fy_node_get_nearest_anchor(fyn);
    if (!fya)
        return fy_node_get_path(fyn);

    fyn_anchor = fy_anchor_node(fya);

    text = fy_anchor_get_text(fya, &len);
    if (!text)
        return NULL;

    if (fyn_anchor == fyn)
        str = alloca_sprintf("*%.*s", (int) len, text);
    else
        str = alloca_sprintf("*%.*s/%s", (int) len, text,
                             fy_node_get_path_relative_to_alloca(fyn_anchor, fyn));

    path = strdup(str);
    return path;
}